

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::w_seq<std::vector<xray_re::lw_face,std::allocator<xray_re::lw_face>>,write_face>
          (xr_writer *this,vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_> *container)

{
  bool bVar1;
  reference face;
  __normal_iterator<const_xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_> *container_local;
  xr_writer *this_local;
  
  end = std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::begin(container);
  local_30._M_current =
       (lw_face *)std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) break;
    face = __gnu_cxx::
           __normal_iterator<const_xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
           ::operator*(&end);
    write_face::operator()((write_face *)((long)&this_local + 7),face,this);
    __gnu_cxx::
    __normal_iterator<const_xray_re::lw_face_*,_std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}